

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_print_mode(kvtree *hash,int indent,int mode)

{
  uint indent_00;
  kvtree_elem_struct *pkVar1;
  size_t __n;
  int iVar2;
  kvtree_elem_struct *pkVar3;
  kvtree_struct *hash_00;
  kvtree_elem_struct *pkVar4;
  char tmp [1024];
  undefined1 local_838 [1024];
  undefined1 local_438 [1032];
  
  if (0 < indent) {
    memset(local_838,0x20,(ulong)(uint)indent);
  }
  local_838[indent] = 0;
  if (hash == (kvtree *)0x0) {
    printf("%sNULL LIST\n",local_838);
  }
  else {
    pkVar4 = hash->lh_first;
    if (pkVar4 != (kvtree_elem_struct *)0x0) {
      indent_00 = indent + 2;
      __n = 1;
      if (1 < (int)indent_00) {
        __n = (size_t)indent_00;
      }
      do {
        if (-2 < indent) {
          memset(local_438,0x20,__n);
        }
        local_438[(int)indent_00] = 0;
        if (mode == 2) {
          if (pkVar4->key == (char *)0x0) {
            printf("%sNULL KEY\n",local_438);
          }
          else {
            if ((pkVar4->hash != (kvtree_struct *)0x0) &&
               (pkVar1 = pkVar4->hash->lh_first, pkVar1 != (kvtree_elem_struct *)0x0)) {
              iVar2 = 1;
              pkVar3 = pkVar1;
              do {
                pkVar3 = (pkVar3->pointers).le_next;
                iVar2 = iVar2 + -1;
              } while (pkVar3 != (kvtree_elem_struct *)0x0);
              if ((iVar2 == 0) &&
                 ((pkVar1->hash == (kvtree_struct *)0x0 ||
                  (pkVar1->hash->lh_first == (kvtree_elem_struct *)0x0)))) {
                printf("%s%s = %s\n",local_438,pkVar4->key,pkVar1->key);
                goto LAB_00105bc7;
              }
            }
            printf("%s%s\n",local_438);
          }
          hash_00 = pkVar4->hash;
          iVar2 = 2;
LAB_00105bc2:
          kvtree_print_mode(hash_00,indent_00,iVar2);
        }
        else if (mode == 1) {
          if (pkVar4->key == (char *)0x0) {
            printf("%sNULL KEY\n",local_438);
          }
          else {
            printf("%s%s\n",local_438);
          }
          hash_00 = pkVar4->hash;
          iVar2 = 1;
          goto LAB_00105bc2;
        }
LAB_00105bc7:
        pkVar4 = (pkVar4->pointers).le_next;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
    }
  }
  return 0;
}

Assistant:

int kvtree_print_mode(const kvtree* hash, int indent, int mode)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_print(elem, indent + 2, mode);
    }
  } else {
    printf("%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}